

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O0

void __thiscall Rml::ElementScroll::DisableScrollbar(ElementScroll *this,Orientation orientation)

{
  Element *pEVar1;
  Property local_c8;
  Property local_68;
  Orientation local_14;
  ElementScroll *pEStack_10;
  Orientation orientation_local;
  ElementScroll *this_local;
  
  if ((this->scrollbars[orientation].enabled & 1U) != 0) {
    pEVar1 = this->scrollbars[orientation].element;
    local_14 = orientation;
    pEStack_10 = this;
    Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>(&local_68,Hidden);
    Element::SetProperty(pEVar1,Visibility,&local_68);
    Property::~Property(&local_68);
    this->scrollbars[local_14].enabled = false;
    if (this->corner != (Element *)0x0) {
      pEVar1 = this->corner;
      Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>(&local_c8,Hidden);
      Element::SetProperty(pEVar1,Visibility,&local_c8);
      Property::~Property(&local_c8);
    }
  }
  return;
}

Assistant:

void ElementScroll::DisableScrollbar(Orientation orientation)
{
	if (scrollbars[orientation].enabled)
	{
		scrollbars[orientation].element->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));
		scrollbars[orientation].enabled = false;

		if (corner)
			corner->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));
	}
}